

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

OASIS_FLOAT ** __thiscall
summarycalc::alloc_ssl_arrays(summarycalc *this,int summary_set,int sample_size)

{
  uint uVar1;
  OASIS_FLOAT **ppOVar2;
  OASIS_FLOAT *pOVar3;
  OASIS_FLOAT **extraout_RAX;
  ulong uVar4;
  long lVar5;
  
  if (this->min_summary_id_[summary_set] == 1) {
    uVar1 = this->max_summary_id_[summary_set];
    lVar5 = (long)(int)uVar1;
    uVar4 = lVar5 * 8 + 8;
    if (lVar5 < -1) {
      uVar4 = 0xffffffffffffffff;
    }
    ppOVar2 = (OASIS_FLOAT **)operator_new__(uVar4);
    if (-1 < lVar5) {
      lVar5 = (long)sample_size + (long)this->num_idx_;
      uVar4 = lVar5 * 4 + 4;
      if ((int)lVar5 < -1) {
        uVar4 = 0xffffffffffffffff;
      }
      lVar5 = 0;
      do {
        pOVar3 = (OASIS_FLOAT *)operator_new__(uVar4);
        ppOVar2[lVar5] = pOVar3;
        lVar5 = lVar5 + 1;
      } while ((ulong)uVar1 + 1 != lVar5);
    }
    return ppOVar2;
  }
  alloc_ssl_arrays();
  lVar5 = 0;
  ppOVar2 = extraout_RAX;
  do {
    if (this->fout[lVar5] != (FILE *)0x0) {
      ppOVar2 = alloc_ssl_arrays(this,(int)lVar5,summary_set);
      this->sssl[lVar5] = ppOVar2;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  return ppOVar2;
}

Assistant:

OASIS_FLOAT **summarycalc::alloc_ssl_arrays(int summary_set, int sample_size)
{
	if (min_summary_id_[summary_set] != 1) {
		fprintf(stderr, "FATAL: summarycalc: Minimum summary ID is not equal to one\n");
		exit(-1);
	}
	int maxsummaryids = max_summary_id_[summary_set] ;
	OASIS_FLOAT **ssl = new OASIS_FLOAT*[maxsummaryids + 1];
	for (int i = 0; i <= maxsummaryids; i++){
		ssl[i] = new OASIS_FLOAT[sample_size + num_idx_ + 1];   // allocate for -5, -4, -3, -2, -1, 0 as well as samplesize
	}
	return ssl;
}